

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case3106(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t in_ECX;
  allocator<char> local_369;
  string local_368;
  Decl local_348;
  Decl local_280;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"typedef const int x ;",&local_31);
  Expectation::Expectation(&local_1b8);
  Decl::Decl(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"x",&local_369);
  pDVar1 = Decl::Type(&local_348,&local_368);
  pDVar1 = Decl::inNameSpace(pDVar1,OrdinaryIdentifiers);
  pDVar1 = Decl::withScopeKind(pDVar1,File);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,Const);
  Decl::Decl(&local_280,pDVar1);
  pEVar2 = Expectation::declaration(&local_1b8,&local_280);
  Expectation::Expectation(&local_100,pEVar2);
  bind(this,(int)local_30,(sockaddr *)&local_100,in_ECX);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_280);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  Decl::~Decl(&local_348);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case3106()
{
    bind("typedef const int x ;",
         Expectation()
             .declaration(Decl()
                          .Type("x")
                          .inNameSpace(NameSpace::OrdinaryIdentifiers)
                          .withScopeKind(ScopeKind::File)
                          .ty_.Basic(BasicTypeKind::Int_S, CVR::Const)));
}